

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O2

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket,SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  undefined4 *puVar1;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  
  if (Js::Configuration::Global[0x2c158] == '\x01') {
    uVar5 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
    if ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
        super_SmallHeapBlockT<SmallAllocationBlockAttributes>.heapBucket != heapBucket) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar4) goto LAB_00257b2e;
      *puVar1 = 0;
    }
    SmallHeapBlockT<SmallAllocationBlockAttributes>::BackgroundReleasePagesSweep
              ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock,this->recycler);
    pSVar2 = (this->finalizableData).bucketData[uVar5].pendingEmptyBlockList;
    if (pSVar2 == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      if ((this->finalizableData).bucketData[uVar5].pendingEmptyBlockListTail !=
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar4) {
LAB_00257b2e:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar1 = 0;
      }
      (this->finalizableData).bucketData[uVar5].pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
    }
    (heapBlock->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next =
         (SmallHeapBlockT<SmallAllocationBlockAttributes> *)pSVar2;
    (this->finalizableData).bucketData[uVar5].pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}